

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O0

int __thiscall ArithmeticModel::init(ArithmeticModel *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  U32 *pUVar3;
  uint uVar4;
  uint local_2c;
  uint local_28;
  U32 k_1;
  U32 k;
  U32 table_bits;
  U32 *table_local;
  ArithmeticModel *this_local;
  
  if (this->distribution == (U32 *)0x0) {
    if ((this->symbols < 2) || (0x800 < this->symbols)) {
      return -1;
    }
    this->last_symbol = this->symbols - 1;
    if (((this->compress & 1U) == 0) && (0x10 < this->symbols)) {
      k_1 = 3;
      while ((uint)(1 << ((byte)k_1 + 2 & 0x1f)) < this->symbols) {
        k_1 = k_1 + 1;
      }
      this->table_size = 1 << ((byte)k_1 & 0x1f);
      this->table_shift = 0xf - k_1;
      auVar1 = ZEXT416(this->symbols * 2 + this->table_size + 2) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pUVar3 = (U32 *)operator_new__(uVar2);
      this->distribution = pUVar3;
      this->decoder_table = this->distribution + (this->symbols << 1);
    }
    else {
      this->decoder_table = (U32 *)0x0;
      this->table_shift = 0;
      this->table_size = 0;
      auVar1 = ZEXT416(this->symbols << 1) * ZEXT816(4);
      uVar2 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pUVar3 = (U32 *)operator_new__(uVar2);
      this->distribution = pUVar3;
    }
    if (this->distribution == (U32 *)0x0) {
      return -1;
    }
    this->symbol_count = this->distribution + this->symbols;
  }
  this->total_count = 0;
  this->update_cycle = this->symbols;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    for (local_2c = 0; local_2c < this->symbols; local_2c = local_2c + 1) {
      this->symbol_count[local_2c] = 1;
    }
  }
  else {
    for (local_28 = 0; local_28 < this->symbols; local_28 = local_28 + 1) {
      this->symbol_count[local_28] = *(U32 *)(ctx + (ulong)local_28 * 4);
    }
  }
  update(this);
  uVar4 = this->symbols + 6 >> 1;
  this->update_cycle = uVar4;
  this->symbols_until_update = uVar4;
  return 0;
}

Assistant:

I32 ArithmeticModel::init(U32* table)
{
  if (distribution == 0)
  {
    if ( (symbols < 2) || (symbols > (1 << 11)) )
    {
      return -1; // invalid number of symbols
    }
    last_symbol = symbols - 1;
    if ((!compress) && (symbols > 16))
    {
      U32 table_bits = 3;
      while (symbols > (1U << (table_bits + 2))) ++table_bits;
      table_size  = 1 << table_bits;
      table_shift = DM__LengthShift - table_bits;
      distribution = new U32[2*symbols+table_size+2];
      decoder_table = distribution + 2 * symbols;
    }
    else // small alphabet: no table needed
    {                                  
      decoder_table = 0;
      table_size = table_shift = 0;
      distribution = new U32[2*symbols];
    }
    if (distribution == 0)
    {
      return -1; // "cannot allocate model memory");
    }
    symbol_count = distribution + symbols;
  }

  total_count = 0;
  update_cycle = symbols;
  if (table)
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = table[k];
  else
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = 1;

  update();
  symbols_until_update = update_cycle = (symbols + 6) >> 1;

  return 0;
}